

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  pointer pcVar1;
  LogMessage *other;
  string *psVar2;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/arenastring.h"
               ,0x173);
    other = LogMessage::operator<<(&local_68,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(&local_29,other);
    LogMessage::~LogMessage(&local_68);
  }
  if (arena == (Arena *)0x0) {
    psVar2 = (string *)operator_new(0x20);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (initial_value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + initial_value->_M_string_length);
  }
  else {
    if (*(long *)(arena + 0x70) != 0) {
      Arena::OnArenaAllocation(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    psVar2 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (initial_value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + initial_value->_M_string_length);
  }
  this->ptr_ = psVar2;
  return;
}

Assistant:

PROTOBUF_NOINLINE
  void CreateInstance(Arena* arena, const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    // uses "new ::std::string" when arena is nullptr
    ptr_ = Arena::Create< ::std::string>(arena, *initial_value);
  }